

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_kv_pair
          (parser_t<comments_skipper_t> *this)

{
  events_aggregator_t *this_00;
  string local_30;
  parser_t<comments_skipper_t> *local_10;
  parser_t<comments_skipper_t> *this_local;
  
  this_00 = &this->handler->super_events_aggregator_t;
  local_10 = this;
  parse_key_abi_cxx11_(&local_30,this);
  events_aggregator_t::key(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  skip_spaces(this);
  parse_chars<2ul>(this,(char (*) [2])0x1fca32);
  skip_spaces(this);
  parse_value(this);
  return;
}

Assistant:

void parse_kv_pair() {
        handler.key(parse_key());
        skip_spaces();
        parse_chars("=");
        skip_spaces();
        parse_value();
    }